

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintTupleTo<std::tuple<ot::commissioner::PendingOperationalDataset&,unsigned_short>,1ul>
               (tuple<ot::commissioner::PendingOperationalDataset_&,_unsigned_short> *t,
               ostream *param_2)

{
  PendingOperationalDataset *value;
  ostream *os_local;
  tuple<ot::commissioner::PendingOperationalDataset_&,_unsigned_short> *t_local;
  
  PrintTupleTo<std::tuple<ot::commissioner::PendingOperationalDataset&,unsigned_short>>(t,param_2);
  value = std::get<0ul,ot::commissioner::PendingOperationalDataset&,unsigned_short>(t);
  UniversalPrinter<ot::commissioner::PendingOperationalDataset_&>::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}